

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXMLWrapper.h
# Opt level: O3

ssize_t __thiscall
Assimp::CIrrXML_IOStreamReader::read
          (CIrrXML_IOStreamReader *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  
  if ((int)__buf < 0) {
    uVar3 = 0;
  }
  else {
    sVar1 = this->t;
    pcVar2 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar2;
    uVar3 = (ulong)(uint)((int)uVar4 - (int)sVar1);
    if (((ulong)__buf & 0xffffffff) + sVar1 <= uVar4) {
      uVar3 = (ulong)__buf & 0xffffffff;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),pcVar2 + sVar1,(long)(int)uVar3);
    this->t = this->t + (long)(int)uVar3;
  }
  return uVar3;
}

Assistant:

virtual int read(void* buffer, int sizeToRead)  {
        if(sizeToRead<0) {
            return 0;
        }
        if(t+sizeToRead>data.size()) {
            sizeToRead = static_cast<int>(data.size()-t);
        }

        memcpy(buffer,&data.front()+t,sizeToRead);

        t += sizeToRead;
        return sizeToRead;
    }